

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

Own<kj::_::ForkBranch<kj::_::Void>_> __thiscall
kj::heap<kj::_::ForkBranch<kj::_::Void>,kj::Own<kj::_::ForkHub<kj::_::Void>>>
          (kj *this,Own<kj::_::ForkHub<kj::_::Void>_> *params)

{
  ForkBranch<kj::_::Void> *this_00;
  ForkBranch<kj::_::Void> *extraout_RDX;
  Own<kj::_::ForkBranch<kj::_::Void>_> OVar1;
  Own<kj::_::ForkHubBase> local_28;
  
  this_00 = (ForkBranch<kj::_::Void> *)operator_new(0x30);
  local_28.disposer = params->disposer;
  local_28.ptr = &params->ptr->super_ForkHubBase;
  params->ptr = (ForkHub<kj::_::Void> *)0x0;
  _::ForkBranch<kj::_::Void>::ForkBranch(this_00,&local_28);
  *(undefined8 **)this = &_::HeapDisposer<kj::_::ForkBranch<kj::_::Void>>::instance;
  *(ForkBranch<kj::_::Void> **)(this + 8) = this_00;
  Own<kj::_::ForkHubBase>::dispose(&local_28);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}